

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::TextureTestBase::prepareSSBs
          (TextureTestBase *this,GLuint param_1,ShaderInterface *si,Program *program,Buffer *buffer)

{
  GLuint GVar1;
  Variable *this_00;
  bool bVar2;
  uint uVar3;
  pointer ppVVar4;
  pointer ppVVar5;
  uint uVar6;
  Program *program_00;
  uint uVar7;
  
  ppVVar4 = (si->m_ssb_blocks).
            super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVVar5 = (si->m_ssb_blocks).
            super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVVar5 != ppVVar4) {
    uVar6 = 0;
    for (uVar7 = 0; (ulong)uVar7 < (ulong)((long)ppVVar5 - (long)ppVVar4 >> 3); uVar7 = uVar7 + 1) {
      this_00 = ppVVar4[uVar7];
      bVar2 = Utils::Variable::IsBlock(this_00);
      if ((bVar2) &&
         (GVar1 = (this_00->m_descriptor).m_n_array_elements,
         uVar3 = (GVar1 + (GVar1 == 0)) * (this_00->m_descriptor).m_expected_stride_of_element +
                 (this_00->m_descriptor).m_offset, (int)uVar6 <= (int)uVar3)) {
        uVar6 = uVar3;
      }
      ppVVar4 = (si->m_ssb_blocks).
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVVar5 = (si->m_ssb_blocks).
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    Utils::Program::Use(program);
    Utils::Buffer::Bind(buffer);
    uVar7 = 0;
    program_00 = (Program *)&DAT_00000004;
    Utils::Buffer::Data(buffer,StaticDraw,(ulong)uVar6,(GLvoid *)0x0);
    while( true ) {
      ppVVar4 = (si->m_ssb_blocks).
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(si->m_ssb_blocks).
                        super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar4 >> 3) <=
          (ulong)uVar7) break;
      prepareUniform(this,program_00,ppVVar4[uVar7],buffer);
      uVar7 = uVar7 + 1;
    }
  }
  return;
}

Assistant:

void TextureTestBase::prepareSSBs(GLuint /* test_case_index */, Utils::ShaderInterface& si, Utils::Program& program,
								  Utils::Buffer& buffer)
{
	/* Skip if there are no input variables in vertex shader */
	if (0 == si.m_ssb_blocks.size())
	{
		return;
	}

	/* Calculate vertex stride */
	GLint ssbs_stride = 0;

	for (GLuint i = 0; i < si.m_ssb_blocks.size(); ++i)
	{
		Utils::Variable& variable = *si.m_ssb_blocks[i];

		if (false == variable.IsBlock())
		{
			continue;
		}

		GLint variable_stride = variable.GetStride();

		GLint ends_at = variable_stride + variable.m_descriptor.m_offset;

		ssbs_stride = std::max(ssbs_stride, ends_at);
	}

	/* Set active program */
	program.Use();

	/* Allocate */
	buffer.Bind();
	buffer.Data(Utils::Buffer::StaticDraw, ssbs_stride, 0);

	/* Set up uniforms */
	for (GLuint i = 0; i < si.m_ssb_blocks.size(); ++i)
	{
		Utils::Variable& variable = *si.m_ssb_blocks[i];

		/* prepareUnifor should work fine for ssb blocks */
		prepareUniform(program, variable, buffer);
	}
}